

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall
rsg::FloatLiteral::FloatLiteral
          (FloatLiteral *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  VariableType *pVVar5;
  Random *this_00;
  float *pfVar6;
  ConstStridedValueAccess<64> CVar7;
  int local_ec;
  undefined1 auStack_e8 [4];
  int ndx;
  ExecValueAccess access;
  float value;
  int numSteps;
  Scalar local_c8;
  Scalar local_c4;
  ConstValueAccess local_c0;
  ConstStridedValueAccess<1> local_b0;
  ConstValueAccess local_a0;
  ConstStridedValueAccess<1> local_90;
  VariableType local_80;
  float local_30;
  float local_2c;
  float step;
  float maxVal;
  float minVal;
  GeneratorState *local_18;
  GeneratorState *state_local;
  FloatLiteral *this_local;
  
  local_18 = state;
  state_local = (GeneratorState *)this;
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__FloatLiteral_0025a910;
  pVVar5 = VariableType::getScalarType(TYPE_FLOAT);
  ValueStorage<64>::ValueStorage(&this->m_value,pVVar5);
  step = -10.0;
  local_2c = 10.0;
  local_30 = 0.25;
  pVVar5 = ConstValueRangeAccess::getType(&valueRange);
  VariableType::VariableType(&local_80,TYPE_FLOAT,1);
  bVar3 = VariableType::operator==(pVVar5,&local_80);
  VariableType::~VariableType(&local_80);
  if (bVar3) {
    local_a0 = ConstValueRangeAccess::getMin(&valueRange);
    local_90 = ConstStridedValueAccess<1>::component(&local_a0,0);
    step = ConstStridedValueAccess<1>::asFloat(&local_90);
    local_c0 = ConstValueRangeAccess::getMax(&valueRange);
    local_b0 = ConstStridedValueAccess<1>::component(&local_c0,0);
    local_2c = ConstStridedValueAccess<1>::asFloat(&local_b0);
    local_c4 = Scalar::min<float>();
    Scalar::Scalar((Scalar *)&local_c8.boolVal,step);
    bVar3 = Scalar::operator==((Scalar *)&local_c4.boolVal,local_c8);
    if (bVar3) {
      step = -10.0;
    }
    numSteps = (int)Scalar::max<float>();
    Scalar::Scalar((Scalar *)&value,local_2c);
    bVar3 = Scalar::operator==((Scalar *)&numSteps,(Scalar)value);
    if (bVar3) {
      local_2c = 10.0;
    }
  }
  fVar2 = step;
  fVar1 = local_30;
  access.super_ConstStridedValueAccess<64>.m_value._4_4_ = (int)((local_2c - step) / local_30) + 1;
  this_00 = GeneratorState::getRandom(local_18);
  iVar4 = de::Random::getInt(this_00,0,access.super_ConstStridedValueAccess<64>.m_value._4_4_);
  access.super_ConstStridedValueAccess<64>.m_value._0_4_ =
       deFloatClamp(fVar1 * (float)iVar4 + fVar2,step,local_2c);
  pVVar5 = VariableType::getScalarType(TYPE_FLOAT);
  CVar7 = (ConstStridedValueAccess<64>)ValueStorage<64>::getValue(&this->m_value,pVVar5);
  local_ec = 0;
  while( true ) {
    fVar1 = access.super_ConstStridedValueAccess<64>.m_value._0_4_;
    access.super_ConstStridedValueAccess<64>.m_type = (VariableType *)CVar7.m_value;
    _auStack_e8 = CVar7.m_type;
    if (0x3f < local_ec) break;
    pfVar6 = StridedValueAccess<64>::asFloat((StridedValueAccess<64> *)auStack_e8,local_ec);
    CVar7.m_value = (Scalar *)access.super_ConstStridedValueAccess<64>.m_type;
    CVar7.m_type = _auStack_e8;
    *pfVar6 = fVar1;
    local_ec = local_ec + 1;
  }
  return;
}

Assistant:

FloatLiteral::FloatLiteral (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_value(VariableType::getScalarType(VariableType::TYPE_FLOAT))
{
	float minVal	= -10.0f;
	float maxVal	= +10.0f;
	float step		= 0.25f;

	if (valueRange.getType() == VariableType(VariableType::TYPE_FLOAT, 1))
	{
		minVal = valueRange.getMin().component(0).asFloat();
		maxVal = valueRange.getMax().component(0).asFloat();

		if (Scalar::min<float>() == minVal)
			minVal = -10.0f;

		if (Scalar::max<float>() == maxVal)
			maxVal = +10.0f;
	}

	int numSteps = (int)((maxVal-minVal)/step) + 1;

	const float		value	= deFloatClamp(minVal + step*(float)state.getRandom().getInt(0, numSteps), minVal, maxVal);
	ExecValueAccess	access	= m_value.getValue(VariableType::getScalarType(VariableType::TYPE_FLOAT));

	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		access.asFloat(ndx) = value;
}